

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

string * __thiscall
PacketProcessor::GetFamilyName_abi_cxx11_
          (string *__return_storage_ptr__,PacketProcessor *this,PacketFamily family)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "INTERNAL";
    break;
  case 1:
    __s = "Connection";
    break;
  case 2:
    __s = "Account";
    break;
  case 3:
    __s = "Character";
    break;
  case 4:
    __s = "Login";
    break;
  case 5:
    __s = "Welcome";
    break;
  case 6:
    __s = "Walk";
    break;
  case 7:
    __s = "Face";
    break;
  case 8:
    __s = "Chair";
    break;
  case 9:
    __s = "Emote";
    break;
  case 0xb:
    __s = "Attack";
    break;
  case 0xc:
    __s = "Spell";
    break;
  case 0xd:
    __s = "Shop";
    break;
  case 0xe:
    __s = "Item";
    break;
  case 0x10:
    __s = "StatSkill";
    break;
  case 0x11:
    __s = "Global";
    break;
  case 0x12:
    __s = "Talk";
    break;
  case 0x13:
    __s = "Warp";
    break;
  case 0x15:
    __s = "Jukebox";
    break;
  case 0x16:
    __s = "Players";
    break;
  case 0x17:
    __s = "Avatar";
    break;
  case 0x18:
    __s = "Party";
    break;
  case 0x19:
    __s = "Refresh";
    break;
  case 0x1a:
    __s = "NPC";
    break;
  case 0x1b:
    __s = "Player_Range";
    break;
  case 0x1c:
    __s = "NPC_Range";
    break;
  case 0x1d:
    __s = "Range";
    break;
  case 0x1e:
    __s = "Paperdoll";
    break;
  case 0x1f:
    __s = "Effect";
    break;
  case 0x20:
    __s = "Trade";
    break;
  case 0x21:
    __s = "Chest";
    break;
  case 0x22:
    __s = "Door";
    break;
  case 0x23:
    __s = "Message";
    break;
  case 0x24:
    __s = "Bank";
    break;
  case 0x25:
    __s = "Locker";
    break;
  case 0x26:
    __s = "Barber";
    break;
  case 0x27:
    __s = "Guild";
    break;
  case 0x28:
    __s = "Music";
    break;
  case 0x29:
    __s = "Sit";
    break;
  case 0x2a:
    __s = "Recover";
    break;
  case 0x2b:
    __s = "Board";
    break;
  case 0x2c:
    __s = "Cast";
    break;
  case 0x2d:
    __s = "Arena";
    break;
  case 0x2e:
    __s = "Priest";
    break;
  case 0x2f:
    __s = "Marriage";
    break;
  case 0x30:
    __s = "AdminInteract";
    break;
  case 0x31:
    __s = "Citizen";
    break;
  case 0x32:
    __s = "Quest";
    break;
  case 0x33:
    __s = "Book";
    break;
  default:
    if ((int)this == 0xff) {
      __s = "Init";
      break;
    }
  case 10:
  case 0xf:
  case 0x14:
    __s = "UNKNOWN";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::GetFamilyName(PacketFamily family)
{
	switch (family)
	{
		case PACKET_INTERNAL: return "INTERNAL";
		case PACKET_CONNECTION: return "Connection";
		case PACKET_ACCOUNT: return "Account";
		case PACKET_CHARACTER: return "Character";
		case PACKET_LOGIN: return "Login";
		case PACKET_WELCOME: return "Welcome";
		case PACKET_WALK: return "Walk";
		case PACKET_FACE: return "Face";
		case PACKET_CHAIR: return "Chair";
		case PACKET_EMOTE: return "Emote";
		case PACKET_ATTACK: return "Attack";
		case PACKET_SPELL: return "Spell";
		case PACKET_SHOP: return "Shop";
		case PACKET_ITEM: return "Item";
		case PACKET_STATSKILL: return "StatSkill";
		case PACKET_GLOBAL: return "Global";
		case PACKET_TALK: return "Talk";
		case PACKET_WARP: return "Warp";
		case PACKET_JUKEBOX: return "Jukebox";
		case PACKET_PLAYERS: return "Players";
		case PACKET_AVATAR: return "Avatar";
		case PACKET_PARTY: return "Party";
		case PACKET_REFRESH: return "Refresh";
		case PACKET_NPC: return "NPC";
		case PACKET_PLAYER_RANGE: return "Player_Range";
		case PACKET_NPC_RANGE: return "NPC_Range";
		case PACKET_RANGE: return "Range";
		case PACKET_PAPERDOLL: return "Paperdoll";
		case PACKET_EFFECT: return "Effect";
		case PACKET_TRADE: return "Trade";
		case PACKET_CHEST: return "Chest";
		case PACKET_DOOR: return "Door";
		case PACKET_MESSAGE: return "Message";
		case PACKET_BANK: return "Bank";
		case PACKET_LOCKER: return "Locker";
		case PACKET_BARBER: return "Barber";
		case PACKET_GUILD: return "Guild";
		case PACKET_MUSIC: return "Music";
		case PACKET_SIT: return "Sit";
		case PACKET_RECOVER: return "Recover";
		case PACKET_BOARD: return "Board";
		case PACKET_CAST: return "Cast";
		case PACKET_ARENA: return "Arena";
		case PACKET_PRIEST: return "Priest";
		case PACKET_MARRIAGE: return "Marriage";
		case PACKET_ADMININTERACT: return "AdminInteract";
		case PACKET_CITIZEN: return "Citizen";
		case PACKET_QUEST: return "Quest";
		case PACKET_BOOK: return "Book";
		case PACKET_F_INIT: return "Init";
		default: return "UNKNOWN";
	}
}